

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O0

void __thiscall
google::protobuf::
RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
UnsafeArenaExtractSubrange
          (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,int start,int num,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **elements)

{
  string *__dest;
  int iVar1;
  int iVar2;
  LogMessage *pLVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **ppbVar4;
  undefined1 auVar5 [16];
  LogMessageFatal local_b0 [23];
  Voidify local_99;
  string *local_98;
  string *absl_log_internal_check_op_result_2;
  undefined8 local_88;
  LogMessageFatal local_80 [23];
  Voidify local_69;
  string *local_68;
  string *absl_log_internal_check_op_result_1;
  undefined1 local_50 [16];
  LogMessageFatal local_40 [23];
  Voidify local_29;
  string *local_28;
  string *absl_log_internal_check_op_result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **elements_local;
  int num_local;
  int start_local;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  absl_log_internal_check_op_result = (string *)elements;
  elements_local._0_4_ = num;
  elements_local._4_4_ = start;
  _num_local = this;
  iVar1 = absl::lts_20240722::log_internal::GetReferenceableValue(start);
  iVar2 = absl::lts_20240722::log_internal::GetReferenceableValue(0);
  local_28 = absl::lts_20240722::log_internal::Check_GEImpl_abi_cxx11_(iVar1,iVar2,"start >= 0");
  if (local_28 != (string *)0x0) {
    local_50 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_28);
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_40,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/repeated_ptr_field.h"
               ,0x5af,local_50._0_8_,local_50._8_8_);
    pLVar3 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_40);
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_29,pLVar3);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_40);
  }
  iVar1 = absl::lts_20240722::log_internal::GetReferenceableValue((int)elements_local);
  iVar2 = absl::lts_20240722::log_internal::GetReferenceableValue(0);
  local_68 = absl::lts_20240722::log_internal::Check_GEImpl_abi_cxx11_(iVar1,iVar2,"num >= 0");
  if (local_68 != (string *)0x0) {
    auVar5 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_68);
    local_88 = auVar5._8_8_;
    absl_log_internal_check_op_result_2 = auVar5._0_8_;
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_80,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/repeated_ptr_field.h"
               ,0x5b0,absl_log_internal_check_op_result_2,local_88);
    pLVar3 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_80);
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_69,pLVar3);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_80);
  }
  iVar1 = absl::lts_20240722::log_internal::GetReferenceableValue
                    (elements_local._4_4_ + (int)elements_local);
  iVar2 = size(this);
  iVar2 = absl::lts_20240722::log_internal::GetReferenceableValue(iVar2);
  local_98 = absl::lts_20240722::log_internal::Check_LEImpl_abi_cxx11_
                       (iVar1,iVar2,"start + num <= size()");
  __dest = absl_log_internal_check_op_result;
  if (local_98 != (string *)0x0) {
    auVar5 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_98);
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_b0,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/repeated_ptr_field.h"
               ,0x5b1,auVar5._0_8_,auVar5._8_8_);
    pLVar3 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_b0);
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_99,pLVar3);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_b0);
  }
  if (0 < (int)elements_local) {
    if (absl_log_internal_check_op_result != (string *)0x0) {
      ppbVar4 = data(this);
      memcpy(__dest,ppbVar4 + elements_local._4_4_,(long)(int)elements_local << 3);
    }
    google::protobuf::internal::RepeatedPtrFieldBase::CloseGap((int)this,elements_local._4_4_);
  }
  return;
}

Assistant:

inline void RepeatedPtrField<Element>::UnsafeArenaExtractSubrange(
    int start, int num, Element** elements) {
  ABSL_DCHECK_GE(start, 0);
  ABSL_DCHECK_GE(num, 0);
  ABSL_DCHECK_LE(start + num, size());

  if (num > 0) {
    // Save the values of the removed elements if requested.
    if (elements != nullptr) {
      memcpy(elements, data() + start, num * sizeof(Element*));
    }
    CloseGap(start, num);
  }
}